

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_call(dmr_C *C,expression *expr)

{
  byte bVar1;
  ptr_list *ppVar2;
  _func_int_dmr_C_ptr_expression_ptr *p_Var3;
  ulong uVar4;
  expression_list *peVar5;
  int iVar6;
  int iVar7;
  symbol *psVar8;
  symbol *fn;
  symbol *psVar9;
  expression *peVar10;
  symbol *psVar11;
  symbol *psVar12;
  char *pcVar13;
  uint uVar14;
  expression_list *sym;
  long lVar15;
  void **rp;
  bool bVar16;
  undefined1 local_b0 [8];
  ptr_list_iter argtypeiter__;
  ptr_list_iter argiter__;
  ptr_list_iter expriter__;
  uint local_54;
  
  peVar10 = (expr->field_5).field_3.unop;
  ppVar2 = (ptr_list *)(expr->field_5).field_2.string;
  psVar8 = dmrC_evaluate_expression(C,peVar10);
  if (psVar8 != (symbol *)0x0) {
    psVar8 = peVar10->ctype;
    fn = psVar8;
    if (*(char *)psVar8 == '\x03') {
      fn = *(symbol **)((long)&psVar8->field_14 + 0x38);
    }
    if (*(char *)fn == '\x04') {
      fn = dmrC_examine_symbol_type(C->S,(fn->field_14).field_2.ctype.base_type);
    }
    if (*(char *)fn == '\x05') {
      examine_fn_arguments(C,fn);
      if ((((*(char *)psVar8 == '\x03') && (*(char *)peVar10 == '\t')) &&
          (psVar8->op != (symbol_op *)0x0)) &&
         (p_Var3 = psVar8->op->args, p_Var3 != (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
        iVar6 = (*p_Var3)(C,expr);
        if (iVar6 == 0) {
          return (symbol *)0x0;
        }
      }
      else {
        ptrlist_forward_iterator
                  ((ptr_list_iter *)local_b0,(ptr_list *)(fn->field_14).field_2.arguments);
        psVar9 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_b0);
        ptrlist_forward_iterator((ptr_list_iter *)&argiter__.__nr,ppVar2);
        peVar10 = (expression *)ptrlist_iter_next((ptr_list_iter *)&argiter__.__nr);
        bVar16 = peVar10 == (expression *)0x0;
        if (!bVar16) {
          local_54 = 1;
          do {
            ppVar2 = expriter__.__head;
            lVar15 = (long)(int)expriter__.__list;
            psVar11 = dmrC_evaluate_expression(C,peVar10);
            if (psVar11 != (symbol *)0x0) {
              rp = ppVar2->list_ + lVar15;
              if (psVar9 == (symbol *)0x0) {
                psVar9 = psVar11;
                if (*(char *)psVar11 == '\x03') {
                  psVar9 = *(symbol **)((long)&psVar11->field_14 + 0x38);
                }
                if (*(byte *)psVar9 == 0xb) {
                  psVar9 = dmrC_evaluate_expression(C,(psVar9->field_14).field_2.initializer);
                  if (psVar9 == (symbol *)0x0) {
                    psVar9 = &C->S->bad_ctype;
                  }
                  else if (*(char *)psVar9 == '\x03') {
                    psVar9 = *(symbol **)((long)&psVar9->field_14 + 0x38);
                  }
                }
                if (*(byte *)psVar9 == 9) {
                  psVar9 = *(symbol **)((long)&psVar9->field_14 + 0x38);
                }
                bVar1 = *(byte *)psVar9;
                if ((ulong)bVar1 == 2) {
                  psVar12 = (psVar9->field_14).field_2.ctype.base_type;
                  if (psVar12 == &C->S->int_type) {
                    uVar14 = 1;
                  }
                  else {
                    if (psVar12 != &C->S->fp_type) goto LAB_0010d3ab;
                    uVar14 = 9;
                  }
                }
                else {
LAB_0010d3ab:
                  uVar14 = classify_type::type_class[bVar1];
                }
                if ((uVar14 & 9) == 1) {
                  psVar12 = psVar9;
                  if (bVar1 == 0xd) {
                    psVar12 = (psVar9->field_14).field_2.ctype.base_type;
                  }
                  lVar15 = 0xa00;
                  if (C->target->bits_in_int <= (psVar9->field_14).field_1.normal) {
                    uVar4 = (psVar12->field_14).field_2.ctype.modifiers;
                    if ((uVar4 & 0x300) == 0) goto LAB_0010d490;
                    lVar15 = 0xbd0;
                    if (-1 < (char)uVar4) {
                      lVar15 = 0xa00;
                    }
                  }
                  psVar12 = (symbol *)((long)&C->S->C + lVar15);
LAB_0010d490:
                  peVar10 = cast_to(C,peVar10,psVar12);
                  *rp = peVar10;
                }
                else if ((uVar14 & 8) == 0) {
                  if ((uVar14 & 0x10) != 0) {
                    if (peVar10->ctype == &C->S->null_ctype) {
                      psVar12 = &C->S->ptr_ctype;
                      goto LAB_0010d490;
                    }
                    degenerate(C,peVar10);
                  }
                }
                else if ((*(byte *)((long)&psVar9->field_14 + 0x19) & 0x1c) == 0) {
                  psVar12 = &C->S->double_ctype;
                  goto LAB_0010d490;
                }
              }
              else if ((undefined1  [136])
                       ((undefined1  [136])psVar9->field_14 & (undefined1  [136])0x200000000000000)
                       == (undefined1  [136])0x0) {
                dmrC_examine_symbol_type(C->S,psVar9);
                sprintf(evaluate_arguments_where,"argument %d",(ulong)local_54);
                psVar12 = psVar9;
                if (*(char *)psVar9 == '\x03') {
                  psVar12 = *(symbol **)((long)&psVar9->field_14 + 0x38);
                }
                if (*(char *)psVar12 == '\v') {
                  psVar12 = dmrC_evaluate_expression(C,(psVar12->field_14).field_2.initializer);
                  if (psVar12 == (symbol *)0x0) {
                    psVar12 = &C->S->bad_ctype;
                  }
                  else if (*(char *)psVar12 == '\x03') {
                    psVar12 = *(symbol **)((long)&psVar12->field_14 + 0x38);
                  }
                }
                if (*(char *)psVar12 == '\t') {
                  psVar12 = (psVar12->field_14).field_2.ctype.base_type;
                }
                if ((*(char *)psVar12 == '\b') &&
                   ((undefined1  [136])
                    ((undefined1  [136])psVar12->field_14 & (undefined1  [136])0x400000000000000) !=
                    (undefined1  [136])0x0)) {
                  ptrlist_forward_iterator
                            ((ptr_list_iter *)&argtypeiter__.__nr,
                             (ptr_list *)(psVar12->field_14).field_2.symbol_list);
                  do {
                    psVar12 = (symbol *)ptrlist_iter_next((ptr_list_iter *)&argtypeiter__.__nr);
                    if (psVar12 == (symbol *)0x0) goto LAB_0010d4ea;
                    iVar6 = check_assignment_types
                                      (C,psVar12,(expression **)rp,(char **)&expriter__.__nr);
                  } while (iVar6 == 0);
                  if (psVar12 != (symbol *)0x0) goto LAB_0010d502;
                }
LAB_0010d4ea:
                compatible_assignment_types
                          (C,peVar10,psVar9,(expression **)rp,evaluate_arguments_where);
              }
LAB_0010d502:
              local_54 = local_54 + 1;
              psVar9 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_b0);
            }
            if (psVar11 == (symbol *)0x0) {
              if (!bVar16) {
                return (symbol *)0x0;
              }
              break;
            }
            peVar10 = (expression *)ptrlist_iter_next((ptr_list_iter *)&argiter__.__nr);
            bVar16 = peVar10 == (expression *)0x0;
          } while (!bVar16);
        }
        iVar6 = ptrlist_size((ptr_list *)(expr->field_5).field_2.string);
        iVar7 = ptrlist_size((ptr_list *)(fn->field_14).field_2.arguments);
        if (iVar6 < iVar7) {
          pcVar13 = dmrC_show_ident(C,psVar8->ident);
          dmrC_expression_error(C,expr,"not enough arguments for function %s",pcVar13);
        }
        if ((iVar7 < iVar6) &&
           ((undefined1  [136])
            ((undefined1  [136])fn->field_14 & (undefined1  [136])0x4000000000000) ==
            (undefined1  [136])0x0)) {
          pcVar13 = dmrC_show_ident(C,psVar8->ident);
          dmrC_expression_error(C,expr,"too many arguments for function %s",pcVar13);
        }
      }
      if (*(char *)psVar8 == '\x03') {
        iVar6 = 0;
        if (*(char *)(expr->field_5).expr_list == '\t') {
          peVar5 = ((expr->field_5).expr_list)->next_;
          if (((symbol_op *)peVar5->list_[4] == (symbol_op *)0x0) ||
             (p_Var3 = ((symbol_op *)peVar5->list_[4])->evaluate,
             p_Var3 == (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
            if ((*(byte *)((long)peVar5->list_ + 0x42) & 4) != 0) {
              psVar8 = C->current_fn;
              sym = (expression_list *)peVar5->list_[0x15];
              if ((expression_list *)peVar5->list_[0x15] == (expression_list *)0x0) {
                sym = peVar5;
              }
              C->current_fn = (symbol *)sym->list_[0xc];
              iVar6 = dmrC_inline_function(C,expr,(symbol *)sym);
              C->current_fn = psVar8;
            }
          }
          else {
            iVar6 = (*p_Var3)(C,expr);
          }
        }
        if (iVar6 != 0) {
          return expr->ctype;
        }
      }
      psVar8 = (fn->field_14).field_2.ctype.base_type;
      expr->ctype = psVar8;
      return psVar8;
    }
    pcVar13 = dmrC_show_ident(C,psVar8->ident);
    dmrC_expression_error(C,expr,"not a function %s",pcVar13);
    ptrlist_forward_iterator((ptr_list_iter *)&argtypeiter__.__nr,ppVar2);
    while (peVar10 = (expression *)ptrlist_iter_next((ptr_list_iter *)&argtypeiter__.__nr),
          peVar10 != (expression *)0x0) {
      dmrC_evaluate_expression(C,peVar10);
    }
  }
  return (symbol *)0x0;
}

Assistant:

static struct symbol *evaluate_call(struct dmr_C *C, struct expression *expr)
{
	int args, fnargs;
	struct symbol *ctype, *sym;
	struct expression *fn = expr->fn;
	struct expression_list *arglist = expr->args;

	if (!dmrC_evaluate_expression(C, fn))
		return NULL;
	sym = ctype = fn->ctype;
	if (ctype->type == SYM_NODE)
		ctype = ctype->ctype.base_type;
	if (ctype->type == SYM_PTR)
		ctype = dmrC_get_base_type(C->S, ctype);

	if (ctype->type != SYM_FN) {
		struct expression *arg;
		dmrC_expression_error(C, expr, "not a function %s",
			     dmrC_show_ident(C, sym->ident));
		/* do typechecking in arguments */
		FOR_EACH_PTR (arglist, arg) {
			dmrC_evaluate_expression(C, arg);
		} END_FOR_EACH_PTR(arg);
		return NULL;
	}

	examine_fn_arguments(C, ctype);
	if (sym->type == SYM_NODE && fn->type == EXPR_PREOP &&
	    sym->op && sym->op->args) {
		if (!sym->op->args(C, expr))
			return NULL;
	} else {
		if (!evaluate_arguments(C, ctype, arglist))
			return NULL;
		args = dmrC_expression_list_size(expr->args);
		fnargs = dmrC_symbol_list_size(ctype->arguments);
		if (args < fnargs)
			dmrC_expression_error(C, expr,
				     "not enough arguments for function %s",
				     dmrC_show_ident(C, sym->ident));
		if (args > fnargs && !ctype->variadic)
			dmrC_expression_error(C, expr,
				     "too many arguments for function %s",
				     dmrC_show_ident(C, sym->ident));
	}
	if (sym->type == SYM_NODE) {
		if (evaluate_symbol_call(C, expr))
			return expr->ctype;
	}
	expr->ctype = ctype->ctype.base_type;
	return expr->ctype;
}